

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test::
~MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test
          (MessageDifferencerTest_PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest,
     PartialEqualityTestTwoBoolsPresenceFieldMissingWithAddress) {
  util::MessageDifferencer address_differencer;
  address_differencer.set_scope(util::MessageDifferencer::PARTIAL);

  // This differencer is not setting force_compare_no_presence.
  util::MessageDifferencer default_differencer;
  default_differencer.set_scope(util::MessageDifferencer::PARTIAL);
  default_differencer.set_force_compare_no_presence(false);

  // When clearing a singular no presence field, it will be included in the
  // comparison.
  proto3_unittest::TestNoPresenceField msg1 = MakeTestNoPresenceField();
  proto3_unittest::TestNoPresenceField msg2 = MakeTestNoPresenceField();

  const FieldDescriptor* fd1 = msg1.GetDescriptor()->FindFieldByNumber(5);
  TextFormat::Parser::UnsetFieldsMetadata metadata;
  UnsetFieldsMetadataMessageDifferencerTestUtil::AddExplicitUnsetField(
      msg1, *fd1, &metadata);
  address_differencer.set_require_no_presence_fields(metadata);

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Trigger on bool2.
  msg1.clear_no_presence_bool2();

  EXPECT_FALSE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));

  // Triggering on bool2 still ignores bool3.
  msg1.set_no_presence_bool2(true);
  msg1.clear_no_presence_bool3();

  EXPECT_TRUE(address_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));
}